

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm.c
# Opt level: O2

int is_fifo_and_addr_belongs(gpu_object *obj,uint64_t ctx)

{
  ulong uVar1;
  int iVar2;
  fifo_state *pfVar3;
  uint uVar4;
  
  iVar2 = is_fifo_ib_class(obj->class_);
  uVar4 = 0;
  if (iVar2 != 0) {
    pfVar3 = get_fifo_state(obj);
    uVar1 = (pfVar3->ib).addr;
    if (uVar1 <= ctx) {
      uVar4 = (uint)(ctx < uVar1 + (pfVar3->ib).entries * 8);
    }
  }
  return uVar4;
}

Assistant:

int is_fifo_and_addr_belongs(struct gpu_object *obj, uint64_t ctx)
{
	if (is_fifo_ib_class(obj->class_))
	{
		struct fifo_state *state = get_fifo_state(obj);
		return ctx >= state->ib.addr &&
				ctx < state->ib.addr + state->ib.entries * 8;
	}

	//TODO: figure out how to get buffer boundary
	if (0 && is_fifo_dma_class(obj->class_))
	{
		struct fifo_state *state = get_fifo_state(obj);
		return ctx >= state->user.addr &&
				ctx < state->user.addr /*+ what?*/;
	}

	return 0;
}